

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<args::Command_*,_std::allocator<args::Command_*>_> * __thiscall
args::Command::GetCommands
          (vector<args::Command_*,_std::allocator<args::Command_*>_> *__return_storage_ptr__,
          Command *this)

{
  initializer_list<args::Command_*> __l;
  uint uVar1;
  allocator<args::Command_*> local_31;
  Command *local_30;
  iterator local_28;
  size_type local_20;
  Command *local_18;
  Command *this_local;
  
  local_18 = this;
  this_local = (Command *)__return_storage_ptr__;
  if (this->selectedCommand == (Command *)0x0) {
    uVar1 = (*(this->super_Group).super_Base._vptr_Base[2])();
    if ((uVar1 & 1) == 0) {
      local_28 = &local_30;
      local_20 = 1;
      local_30 = this;
      std::allocator<args::Command_*>::allocator(&local_31);
      __l._M_len = local_20;
      __l._M_array = local_28;
      std::vector<args::Command_*,_std::allocator<args::Command_*>_>::vector
                (__return_storage_ptr__,__l,&local_31);
      std::allocator<args::Command_*>::~allocator(&local_31);
    }
    else {
      Group::GetCommands(__return_storage_ptr__,&this->super_Group);
    }
  }
  else {
    (*(this->selectedCommand->super_Group).super_Base._vptr_Base[5])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<Command*> GetCommands() override
            {
                if (selectedCommand != nullptr)
                {
                    return selectedCommand->GetCommands();
                }

                if (Matched())
                {
                    return Group::GetCommands();
                }

                return { this };
            }